

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SoftHSM.cpp
# Opt level: O1

CK_RV __thiscall
SoftHSM::getRSAPrivateKey(SoftHSM *this,RSAPrivateKey *privateKey,Token *token,OSObject *key)

{
  char cVar1;
  int iVar2;
  undefined1 uVar3;
  undefined7 uVar4;
  uchar *in_R8;
  size_t in_R9;
  CK_RV CVar5;
  ByteString coefficient;
  ByteString exponent2;
  ByteString exponent1;
  ByteString prime2;
  ByteString prime1;
  ByteString privateExponent;
  ByteString publicExponent;
  ByteString modulus;
  ByteString local_288;
  ByteString local_260;
  ByteString local_238;
  ByteString local_210;
  ByteString local_1e8;
  ByteString local_1c0;
  ByteString local_198;
  ByteString local_170;
  ByteString local_148;
  undefined **local_120;
  _Vector_base<unsigned_char,_SecureAllocator<unsigned_char>_> local_118;
  undefined **local_f8;
  _Vector_base<unsigned_char,_SecureAllocator<unsigned_char>_> local_f0;
  undefined **local_d0;
  _Vector_base<unsigned_char,_SecureAllocator<unsigned_char>_> local_c8;
  undefined **local_a8;
  _Vector_base<unsigned_char,_SecureAllocator<unsigned_char>_> local_a0;
  undefined **local_80;
  _Vector_base<unsigned_char,_SecureAllocator<unsigned_char>_> local_78;
  undefined **local_58;
  _Vector_base<unsigned_char,_SecureAllocator<unsigned_char>_> local_50;
  
  uVar4 = (undefined7)((ulong)key >> 8);
  uVar3 = token == (Token *)0x0 || privateKey == (RSAPrivateKey *)0x0;
  if (key == (OSObject *)0x0 || (bool)uVar3) {
    return 7;
  }
  iVar2 = (*key->_vptr_OSObject[4])(key,2,0);
  ByteString::ByteString(&local_148);
  ByteString::ByteString(&local_170);
  ByteString::ByteString(&local_198);
  ByteString::ByteString(&local_1c0);
  ByteString::ByteString(&local_1e8);
  ByteString::ByteString(&local_210);
  ByteString::ByteString(&local_238);
  ByteString::ByteString(&local_260);
  if ((char)iVar2 == '\0') {
    (*key->_vptr_OSObject[6])(&local_288,key,0x120);
    ByteString::operator=(&local_148,&local_288);
    local_288._vptr_ByteString = (_func_int **)&PTR__ByteString_0019f880;
    std::_Vector_base<unsigned_char,_SecureAllocator<unsigned_char>_>::~_Vector_base
              (&local_288.byteString.
                super__Vector_base<unsigned_char,_SecureAllocator<unsigned_char>_>);
    (*key->_vptr_OSObject[6])(&local_288,key,0x122);
    ByteString::operator=(&local_170,&local_288);
    local_288._vptr_ByteString = (_func_int **)&PTR__ByteString_0019f880;
    std::_Vector_base<unsigned_char,_SecureAllocator<unsigned_char>_>::~_Vector_base
              (&local_288.byteString.
                super__Vector_base<unsigned_char,_SecureAllocator<unsigned_char>_>);
    (*key->_vptr_OSObject[6])(&local_288,key,0x123);
    ByteString::operator=(&local_198,&local_288);
    local_288._vptr_ByteString = (_func_int **)&PTR__ByteString_0019f880;
    std::_Vector_base<unsigned_char,_SecureAllocator<unsigned_char>_>::~_Vector_base
              (&local_288.byteString.
                super__Vector_base<unsigned_char,_SecureAllocator<unsigned_char>_>);
    (*key->_vptr_OSObject[6])(&local_288,key,0x124);
    ByteString::operator=(&local_1c0,&local_288);
    local_288._vptr_ByteString = (_func_int **)&PTR__ByteString_0019f880;
    std::_Vector_base<unsigned_char,_SecureAllocator<unsigned_char>_>::~_Vector_base
              (&local_288.byteString.
                super__Vector_base<unsigned_char,_SecureAllocator<unsigned_char>_>);
    (*key->_vptr_OSObject[6])(&local_288,key,0x125);
    ByteString::operator=(&local_1e8,&local_288);
    local_288._vptr_ByteString = (_func_int **)&PTR__ByteString_0019f880;
    std::_Vector_base<unsigned_char,_SecureAllocator<unsigned_char>_>::~_Vector_base
              (&local_288.byteString.
                super__Vector_base<unsigned_char,_SecureAllocator<unsigned_char>_>);
    (*key->_vptr_OSObject[6])(&local_288,key,0x126);
    ByteString::operator=(&local_210,&local_288);
    local_288._vptr_ByteString = (_func_int **)&PTR__ByteString_0019f880;
    std::_Vector_base<unsigned_char,_SecureAllocator<unsigned_char>_>::~_Vector_base
              (&local_288.byteString.
                super__Vector_base<unsigned_char,_SecureAllocator<unsigned_char>_>);
    (*key->_vptr_OSObject[6])(&local_288,key,0x127);
    ByteString::operator=(&local_238,&local_288);
    local_288._vptr_ByteString = (_func_int **)&PTR__ByteString_0019f880;
    std::_Vector_base<unsigned_char,_SecureAllocator<unsigned_char>_>::~_Vector_base
              (&local_288.byteString.
                super__Vector_base<unsigned_char,_SecureAllocator<unsigned_char>_>);
    (*key->_vptr_OSObject[6])(&local_288,key,0x128);
    ByteString::operator=(&local_260,&local_288);
    local_288._vptr_ByteString = (_func_int **)&PTR__ByteString_0019f880;
    std::_Vector_base<unsigned_char,_SecureAllocator<unsigned_char>_>::~_Vector_base
              (&local_288.byteString.
                super__Vector_base<unsigned_char,_SecureAllocator<unsigned_char>_>);
  }
  else {
    (*key->_vptr_OSObject[6])(&local_288,key,0x120);
    iVar2 = Token::decrypt(token,(EVP_PKEY_CTX *)&local_288,(uchar *)&local_148,
                           (size_t *)CONCAT71(uVar4,uVar3),in_R8,in_R9);
    local_288._vptr_ByteString = (_func_int **)&PTR__ByteString_0019f880;
    std::_Vector_base<unsigned_char,_SecureAllocator<unsigned_char>_>::~_Vector_base
              (&local_288.byteString.
                super__Vector_base<unsigned_char,_SecureAllocator<unsigned_char>_>);
    if ((char)iVar2 == '\0') {
      cVar1 = '\0';
    }
    else {
      (*key->_vptr_OSObject[6])(&local_288,key,0x122);
      iVar2 = Token::decrypt(token,(EVP_PKEY_CTX *)&local_288,(uchar *)&local_170,
                             (size_t *)CONCAT71(uVar4,uVar3),in_R8,in_R9);
      cVar1 = (char)iVar2;
      local_288._vptr_ByteString = (_func_int **)&PTR__ByteString_0019f880;
      std::_Vector_base<unsigned_char,_SecureAllocator<unsigned_char>_>::~_Vector_base
                (&local_288.byteString.
                  super__Vector_base<unsigned_char,_SecureAllocator<unsigned_char>_>);
    }
    if (cVar1 == '\0') {
      cVar1 = '\0';
    }
    else {
      (*key->_vptr_OSObject[6])(&local_58,key,0x123);
      iVar2 = Token::decrypt(token,(EVP_PKEY_CTX *)&local_58,(uchar *)&local_198,
                             (size_t *)CONCAT71(uVar4,uVar3),in_R8,in_R9);
      cVar1 = (char)iVar2;
      local_58 = &PTR__ByteString_0019f880;
      std::_Vector_base<unsigned_char,_SecureAllocator<unsigned_char>_>::~_Vector_base(&local_50);
    }
    if (cVar1 == '\0') {
      cVar1 = '\0';
    }
    else {
      (*key->_vptr_OSObject[6])(&local_80,key,0x124);
      iVar2 = Token::decrypt(token,(EVP_PKEY_CTX *)&local_80,(uchar *)&local_1c0,
                             (size_t *)CONCAT71(uVar4,uVar3),in_R8,in_R9);
      cVar1 = (char)iVar2;
      local_80 = &PTR__ByteString_0019f880;
      std::_Vector_base<unsigned_char,_SecureAllocator<unsigned_char>_>::~_Vector_base(&local_78);
    }
    if (cVar1 == '\0') {
      cVar1 = '\0';
    }
    else {
      (*key->_vptr_OSObject[6])(&local_a8,key,0x125);
      iVar2 = Token::decrypt(token,(EVP_PKEY_CTX *)&local_a8,(uchar *)&local_1e8,
                             (size_t *)CONCAT71(uVar4,uVar3),in_R8,in_R9);
      cVar1 = (char)iVar2;
      local_a8 = &PTR__ByteString_0019f880;
      std::_Vector_base<unsigned_char,_SecureAllocator<unsigned_char>_>::~_Vector_base(&local_a0);
    }
    if (cVar1 == '\0') {
      cVar1 = '\0';
    }
    else {
      (*key->_vptr_OSObject[6])(&local_d0,key,0x126);
      iVar2 = Token::decrypt(token,(EVP_PKEY_CTX *)&local_d0,(uchar *)&local_210,
                             (size_t *)CONCAT71(uVar4,uVar3),in_R8,in_R9);
      cVar1 = (char)iVar2;
      local_d0 = &PTR__ByteString_0019f880;
      std::_Vector_base<unsigned_char,_SecureAllocator<unsigned_char>_>::~_Vector_base(&local_c8);
    }
    if (cVar1 == '\0') {
      cVar1 = '\0';
    }
    else {
      (*key->_vptr_OSObject[6])(&local_f8,key,0x127);
      iVar2 = Token::decrypt(token,(EVP_PKEY_CTX *)&local_f8,(uchar *)&local_238,
                             (size_t *)CONCAT71(uVar4,uVar3),in_R8,in_R9);
      cVar1 = (char)iVar2;
      local_f8 = &PTR__ByteString_0019f880;
      std::_Vector_base<unsigned_char,_SecureAllocator<unsigned_char>_>::~_Vector_base(&local_f0);
    }
    if (cVar1 == '\0') {
      cVar1 = '\0';
    }
    else {
      (*key->_vptr_OSObject[6])(&local_120,key,0x128);
      iVar2 = Token::decrypt(token,(EVP_PKEY_CTX *)&local_120,(uchar *)&local_260,
                             (size_t *)CONCAT71(uVar4,uVar3),in_R8,in_R9);
      cVar1 = (char)iVar2;
      local_120 = &PTR__ByteString_0019f880;
      std::_Vector_base<unsigned_char,_SecureAllocator<unsigned_char>_>::~_Vector_base(&local_118);
    }
    CVar5 = 5;
    if (cVar1 == '\0') goto LAB_00132a08;
  }
  (**(code **)(*(long *)privateKey + 0x70))(privateKey,&local_148);
  (**(code **)(*(long *)privateKey + 0x78))(privateKey,&local_170);
  (**(code **)(*(long *)privateKey + 0x68))(privateKey,&local_198);
  (**(code **)(*(long *)privateKey + 0x40))(privateKey,&local_1c0);
  (**(code **)(*(long *)privateKey + 0x48))(privateKey,&local_1e8);
  (**(code **)(*(long *)privateKey + 0x58))(privateKey,&local_210);
  (**(code **)(*(long *)privateKey + 0x60))(privateKey,&local_238);
  (**(code **)(*(long *)privateKey + 0x50))(privateKey,&local_260);
  CVar5 = 0;
LAB_00132a08:
  local_260._vptr_ByteString = (_func_int **)&PTR__ByteString_0019f880;
  std::_Vector_base<unsigned_char,_SecureAllocator<unsigned_char>_>::~_Vector_base
            (&local_260.byteString.
              super__Vector_base<unsigned_char,_SecureAllocator<unsigned_char>_>);
  local_238._vptr_ByteString = (_func_int **)&PTR__ByteString_0019f880;
  std::_Vector_base<unsigned_char,_SecureAllocator<unsigned_char>_>::~_Vector_base
            (&local_238.byteString.
              super__Vector_base<unsigned_char,_SecureAllocator<unsigned_char>_>);
  local_210._vptr_ByteString = (_func_int **)&PTR__ByteString_0019f880;
  std::_Vector_base<unsigned_char,_SecureAllocator<unsigned_char>_>::~_Vector_base
            (&local_210.byteString.
              super__Vector_base<unsigned_char,_SecureAllocator<unsigned_char>_>);
  local_1e8._vptr_ByteString = (_func_int **)&PTR__ByteString_0019f880;
  std::_Vector_base<unsigned_char,_SecureAllocator<unsigned_char>_>::~_Vector_base
            (&local_1e8.byteString.
              super__Vector_base<unsigned_char,_SecureAllocator<unsigned_char>_>);
  local_1c0._vptr_ByteString = (_func_int **)&PTR__ByteString_0019f880;
  std::_Vector_base<unsigned_char,_SecureAllocator<unsigned_char>_>::~_Vector_base
            (&local_1c0.byteString.
              super__Vector_base<unsigned_char,_SecureAllocator<unsigned_char>_>);
  local_198._vptr_ByteString = (_func_int **)&PTR__ByteString_0019f880;
  std::_Vector_base<unsigned_char,_SecureAllocator<unsigned_char>_>::~_Vector_base
            (&local_198.byteString.
              super__Vector_base<unsigned_char,_SecureAllocator<unsigned_char>_>);
  local_170._vptr_ByteString = (_func_int **)&PTR__ByteString_0019f880;
  std::_Vector_base<unsigned_char,_SecureAllocator<unsigned_char>_>::~_Vector_base
            (&local_170.byteString.
              super__Vector_base<unsigned_char,_SecureAllocator<unsigned_char>_>);
  local_148._vptr_ByteString = (_func_int **)&PTR__ByteString_0019f880;
  std::_Vector_base<unsigned_char,_SecureAllocator<unsigned_char>_>::~_Vector_base
            (&local_148.byteString.
              super__Vector_base<unsigned_char,_SecureAllocator<unsigned_char>_>);
  return CVar5;
}

Assistant:

CK_RV SoftHSM::getRSAPrivateKey(RSAPrivateKey* privateKey, Token* token, OSObject* key)
{
	if (privateKey == NULL) return CKR_ARGUMENTS_BAD;
	if (token == NULL) return CKR_ARGUMENTS_BAD;
	if (key == NULL) return CKR_ARGUMENTS_BAD;

	// Get the CKA_PRIVATE attribute, when the attribute is not present use default false
	bool isKeyPrivate = key->getBooleanValue(CKA_PRIVATE, false);

	// RSA Private Key Attributes
	ByteString modulus;
	ByteString publicExponent;
	ByteString privateExponent;
	ByteString prime1;
	ByteString prime2;
	ByteString exponent1;
	ByteString exponent2;
	ByteString coefficient;
	if (isKeyPrivate)
	{
		bool bOK = true;
		bOK = bOK && token->decrypt(key->getByteStringValue(CKA_MODULUS), modulus);
		bOK = bOK && token->decrypt(key->getByteStringValue(CKA_PUBLIC_EXPONENT), publicExponent);
		bOK = bOK && token->decrypt(key->getByteStringValue(CKA_PRIVATE_EXPONENT), privateExponent);
		bOK = bOK && token->decrypt(key->getByteStringValue(CKA_PRIME_1), prime1);
		bOK = bOK && token->decrypt(key->getByteStringValue(CKA_PRIME_2), prime2);
		bOK = bOK && token->decrypt(key->getByteStringValue(CKA_EXPONENT_1), exponent1);
		bOK = bOK && token->decrypt(key->getByteStringValue(CKA_EXPONENT_2), exponent2);
		bOK = bOK && token->decrypt(key->getByteStringValue(CKA_COEFFICIENT), coefficient);
		if (!bOK)
			return CKR_GENERAL_ERROR;
	}
	else
	{
		modulus = key->getByteStringValue(CKA_MODULUS);
		publicExponent = key->getByteStringValue(CKA_PUBLIC_EXPONENT);
		privateExponent = key->getByteStringValue(CKA_PRIVATE_EXPONENT);
		prime1 = key->getByteStringValue(CKA_PRIME_1);
		prime2 = key->getByteStringValue(CKA_PRIME_2);
		exponent1 =  key->getByteStringValue(CKA_EXPONENT_1);
		exponent2 = key->getByteStringValue(CKA_EXPONENT_2);
		coefficient = key->getByteStringValue(CKA_COEFFICIENT);
	}

	privateKey->setN(modulus);
	privateKey->setE(publicExponent);
	privateKey->setD(privateExponent);
	privateKey->setP(prime1);
	privateKey->setQ(prime2);
	privateKey->setDP1(exponent1);
	privateKey->setDQ1(exponent2);
	privateKey->setPQ(coefficient);

	return CKR_OK;
}